

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::DateTimePicker::sizeHint(DateTimePicker *this)

{
  int iVar1;
  int extraout_var;
  DateTimePickerPrivate *pDVar2;
  reference pSVar3;
  int extraout_var_00;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long i;
  QByteArrayView QVar8;
  QStyleOption opt;
  QArrayData *local_88 [3];
  QStyleOption local_70 [32];
  QString local_50;
  
  QStyleOption::QStyleOption(local_70,1,0);
  QStyleOption::initFrom((QWidget *)local_70);
  QVar8.m_data = (storage_type *)0x2;
  QVar8.m_size = (qsizetype)local_88;
  QString::fromLatin1(QVar8);
  QFontMetrics::boundingRect(&local_50);
  ((this->d).d)->itemHeight = (extraout_var_00 - extraout_var) + 1;
  if (local_88[0] != (QArrayData *)0x0) {
    LOCK();
    (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88[0],2,8);
    }
  }
  pDVar2 = (this->d).d;
  iVar1 = pDVar2->itemHeight;
  pDVar2->itemTopMargin = iVar1 / 3;
  uVar7 = (pDVar2->itemsMaxCount + -1) * (iVar1 / 3) + pDVar2->itemsMaxCount * iVar1;
  pDVar2->widgetHeight = uVar7;
  pDVar2->currentItemY = (int)uVar7 / 2 - iVar1 / 2;
  uVar5 = 0;
  if (0 < (pDVar2->super_DateTimeParser).sections.d.size) {
    lVar6 = 0;
    i = 0;
    do {
      iVar1 = Section::maxWidth((Section *)
                                ((long)&((pDVar2->super_DateTimeParser).sections.d.ptr)->type +
                                lVar6),local_70);
      pSVar3 = QList<QtMWidgets::Section>::operator[]
                         (&(((this->d).d)->super_DateTimeParser).sections,i);
      pSVar3->sectionWidth = iVar1;
      pDVar2 = (this->d).d;
      iVar1 = pDVar2->itemSideMargin;
      pSVar3 = QList<QtMWidgets::Section>::operator[](&(pDVar2->super_DateTimeParser).sections,i);
      pSVar3->sectionWidth = pSVar3->sectionWidth + iVar1 * 2 + 6;
      pSVar3 = QList<QtMWidgets::Section>::operator[]
                         (&(((this->d).d)->super_DateTimeParser).sections,i);
      uVar4 = (int)uVar5 + pSVar3->sectionWidth;
      uVar5 = (ulong)uVar4;
      i = i + 1;
      pDVar2 = (this->d).d;
      lVar6 = lVar6 + 0x30;
    } while (i < (pDVar2->super_DateTimeParser).sections.d.size);
    uVar7 = pDVar2->widgetHeight;
    uVar5 = (ulong)uVar4;
  }
  QStyleOption::~QStyleOption(local_70);
  return (QSize)((ulong)uVar7 << 0x20 | uVar5);
}

Assistant:

QSize
DateTimePicker::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->itemHeight = opt.fontMetrics.boundingRect( QLatin1String( "AM" ) )
		.height();

	d->itemTopMargin = d->itemHeight / 3;

	d->widgetHeight = d->itemHeight * d->itemsMaxCount +
		( d->itemsMaxCount - 1 ) * d->itemTopMargin;

	d->currentItemY = d->widgetHeight / 2 - d->itemHeight / 2;

	int widgetWidth = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		d->sections[ i ].sectionWidth = d->sections.at( i ).maxWidth( opt );
		d->sections[ i ].sectionWidth += d->itemSideMargin * 2 + 6;
		widgetWidth += d->sections[ i ].sectionWidth;
	}

	return QSize( widgetWidth, d->widgetHeight );
}